

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  short sVar2;
  ImGuiTableColumn *pIVar3;
  bool bVar4;
  ImGuiTableInstanceData *pIVar5;
  int order_n;
  ulong uVar6;
  ImGuiID id;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool held;
  bool hovered;
  float local_80;
  float local_7c;
  ImGuiContext *local_78;
  ImRect hit_rect;
  
  local_78 = GImGui;
  if ((long)table->InstanceCurrent == 0) {
    pIVar5 = &table->InstanceDataFirst;
  }
  else {
    pIVar5 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  fVar8 = (float)(int)(GImGui->CurrentDpiScale * 4.0);
  fVar1 = (table->OuterRect).Max.y;
  local_7c = (float)table->RowBgColor[(ulong)(table->FreezeRowsCount < 1) * 8 + 0x16] +
             table->AngledHeadersHeight;
  fVar10 = (pIVar5->LastOuterHeight + local_7c) - table->AngledHeadersHeight;
  uVar7 = -(uint)(fVar10 <= fVar1);
  local_80 = pIVar5->LastTopHeadersRowHeight + local_7c;
  uVar6 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar6) {
      return;
    }
    if ((table->EnabledMaskByDisplayOrder[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) != 0)
    {
      pIVar3 = (table->Columns).Data;
      sVar2 = (table->DisplayOrderToIndex).Data[uVar6];
      if ((((pIVar3[sVar2].Flags & 0x40000020U) == 0) &&
          ((hit_rect.Max.y = (float)(uVar7 & (uint)fVar1 | ~uVar7 & (uint)fVar10),
           (table->Flags & 0x800) == 0 ||
           (hit_rect.Max.y = local_80, table->IsUsingHeaders != false)))) &&
         ((pIVar3[sVar2].IsVisibleX != false || (table->LastResizedColumn == sVar2)))) {
        pIVar5 = &table->InstanceDataFirst;
        if ((long)table->InstanceCurrent != 0) {
          pIVar5 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
        }
        id = (int)sVar2 + pIVar5->TableInstanceID + 1;
        hit_rect.Min.x = pIVar3[sVar2].MaxX - fVar8;
        hit_rect.Max.x = pIVar3[sVar2].MaxX + fVar8;
        hit_rect.Min.y = local_7c;
        ItemAdd(&hit_rect,id,(ImRect *)0x0,2);
        hovered = false;
        held = false;
        bVar4 = ButtonBehavior(&hit_rect,id,&hovered,&held,0x40910);
        if ((bVar4) && (bVar4 = IsMouseDoubleClicked(0), bVar4)) {
          pIVar3 = (table->Columns).Data;
          if (pIVar3[sVar2].IsEnabled == true) {
            pIVar3[sVar2].CannotSkipItemsQueue = '\x01';
            table->AutoFitSingleColumn = sVar2;
          }
          ClearActiveID();
          held = false;
        }
        if (held == true) {
          if (table->LastResizedColumn == -1) {
            fVar9 = -3.4028235e+38;
            if ((long)table->RightMostEnabledColumn != -1) {
              fVar9 = (table->Columns).Data[table->RightMostEnabledColumn].MaxX;
            }
            table->ResizeLockMinContentsX2 = fVar9;
          }
          table->ResizedColumn = sVar2;
          table->InstanceInteracted = table->InstanceCurrent;
          if (hovered != false) {
LAB_00183ac2:
            if (local_78->HoveredIdTimer <= 0.06 && held == false) goto LAB_00183955;
          }
          table->HoveredColumnBorder = sVar2;
          SetMouseCursor(4);
        }
        else if (hovered == true) goto LAB_00183ac2;
      }
    }
LAB_00183955:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale);
    const float hit_y1 = (table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight - table->AngledHeadersHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastTopHeadersRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}